

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O3

void __thiscall HEkkDual::cleanup(HEkkDual *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  HEkk *pHVar2;
  HEkk *this_00;
  vector<double,_std::allocator<double>_> original_workDual;
  vector<double,_std::allocator<double>_> local_28;
  
  if (this->solve_phase == 1) {
    pHVar2 = this->ekk_instance_;
    iVar1 = pHVar2->dual_simplex_phase1_cleanup_level_;
    pHVar2->dual_simplex_phase1_cleanup_level_ = iVar1 + 1;
    if ((pHVar2->options_->super_HighsOptionsStruct).max_dual_simplex_phase1_cleanup_level <= iVar1)
    {
      highsLogDev(&(pHVar2->options_->super_HighsOptionsStruct).log_options,kError,
                  "Dual simplex cleanup level has exceeded limit of %d\n");
    }
  }
  highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kDetailed,
              "dual-cleanup-shift\n");
  pHVar2 = this->ekk_instance_;
  HEkk::initialiseCost(pHVar2,kDual,-1,false);
  (pHVar2->info_).allow_cost_perturbation = false;
  HEkk::initialiseBound(this->ekk_instance_,kDual,this->solve_phase,false);
  local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00 = this->ekk_instance_;
  if (1 < (this_00->options_->super_HighsOptionsStruct).highs_debug_level) {
    std::vector<double,_std::allocator<double>_>::operator=(&local_28,&(pHVar2->info_).workDual_);
    this_00 = this->ekk_instance_;
  }
  HEkk::computeDual(this_00);
  HEkk::computeSimplexDualInfeasible(this->ekk_instance_);
  this->dualInfeasCount = (this->ekk_instance_->info_).num_dual_infeasibilities;
  HEkk::computeDualObjectiveValue(this->ekk_instance_,this->solve_phase);
  (pHVar2->info_).updated_dual_objective_value = (pHVar2->info_).dual_objective_value;
  if ((pHVar2->info_).run_quiet == false) {
    HEkk::computeSimplexPrimalInfeasible(this->ekk_instance_);
    if (this->solve_phase == 1) {
      HEkk::computeSimplexLpDualInfeasible(this->ekk_instance_);
    }
    reportRebuild(this,-1);
  }
  if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HEkkDual::cleanup() {
  if (solve_phase == kSolvePhase1) {
    // Take action to prevent infinite loop. Shouldn't get to this
    // stage, since cost perturbation isn't permitted unless the dual
    // simplex phase 1 cleanup level is less than the limit
    ekk_instance_.dual_simplex_phase1_cleanup_level_++;
    const bool excessive_cleanup_calls =
        ekk_instance_.dual_simplex_phase1_cleanup_level_ >
        ekk_instance_.options_->max_dual_simplex_phase1_cleanup_level;
    if (excessive_cleanup_calls) {
      highsLogDev(
          ekk_instance_.options_->log_options, HighsLogType::kError,
          "Dual simplex cleanup level has exceeded limit of %d\n",
          (int)ekk_instance_.options_->max_dual_simplex_phase1_cleanup_level);
      assert(!excessive_cleanup_calls);
    }
  }
  highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kDetailed,
              "dual-cleanup-shift\n");
  HighsSimplexInfo& info = ekk_instance_.info_;
  // Remove perturbation and don't permit further perturbation
  ekk_instance_.initialiseCost(SimplexAlgorithm::kDual, kSolvePhaseUnknown);
  info.allow_cost_perturbation = false;
  // No solve_phase term in initialiseBound is surely an omission -
  // when cleanup called in phase 1
  ekk_instance_.initialiseBound(SimplexAlgorithm::kDual, solve_phase);
  // Possibly take a copy of the original duals before recomputing them
  vector<double> original_workDual;
  if (ekk_instance_.options_->highs_debug_level > kHighsDebugLevelCheap)
    original_workDual = info.workDual_;
  // Compute the dual values
  ekk_instance_.computeDual();
  // Possibly analyse the change in duals
  //  debugCleanup(ekk_instance_, original_workDual);
  // Compute the dual infeasibilities
  ekk_instance_.computeSimplexDualInfeasible();
  dualInfeasCount = ekk_instance_.info_.num_dual_infeasibilities;

  // Compute the dual objective value
  ekk_instance_.computeDualObjectiveValue(solve_phase);
  // Now that there's a new dual_objective_value, reset the updated
  // value
  info.updated_dual_objective_value = info.dual_objective_value;

  if (!info.run_quiet) {
    // Report the primal infeasibilities
    ekk_instance_.computeSimplexPrimalInfeasible();
    // In phase 1, report the simplex LP dual infeasibilities
    // In phase 2, report the simplex dual infeasibilities (known)
    if (solve_phase == kSolvePhase1)
      ekk_instance_.computeSimplexLpDualInfeasible();
    reportRebuild(kRebuildReasonCleanup);
  }
}